

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddDefaultValue(Parse *pParse,Expr *pExpr,char *zStart,char *zEnd)

{
  sqlite3 *db_00;
  Table *pTab;
  int iVar1;
  Column *pCol_00;
  Expr *pExpr_00;
  bool local_99;
  Expr *pDfltExpr;
  Expr x;
  int isInit;
  sqlite3 *db;
  Column *pCol;
  Table *p;
  char *zEnd_local;
  char *zStart_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pTab = pParse->pNewTable;
  if (pTab != (Table *)0x0) {
    local_99 = false;
    if ((db_00->init).busy != '\0') {
      local_99 = (db_00->init).iDb != '\x01';
    }
    x.y.sub.regReturn = (int)local_99;
    pCol_00 = pTab->aCol + (pTab->nCol + -1);
    iVar1 = sqlite3ExprIsConstantOrFunction(pExpr,local_99);
    if (iVar1 == 0) {
      sqlite3ErrorMsg(pParse,"default value of column [%s] is not constant",pCol_00->zCnName);
    }
    else if ((pCol_00->colFlags & 0x60) == 0) {
      memset(&pDfltExpr,0,0x48);
      pDfltExpr._0_1_ = 0xb5;
      x._0_8_ = sqlite3DbSpanDup(db_00,zStart,zEnd);
      pDfltExpr._4_4_ = 0x2000;
      x.u = (anon_union_8_2_443a03b8_for_u)pExpr;
      pExpr_00 = sqlite3ExprDup(db_00,(Expr *)&pDfltExpr,1);
      sqlite3DbFree(db_00,(void *)x._0_8_);
      sqlite3ColumnSetExpr(pParse,pTab,pCol_00,pExpr_00);
    }
    else {
      sqlite3ErrorMsg(pParse,"cannot use DEFAULT on a generated column");
    }
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprUnmap(pParse,pExpr);
  }
  sqlite3ExprDelete(db_00,pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddDefaultValue(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* The parsed expression of the default value */
  const char *zStart,      /* Start of the default value text */
  const char *zEnd         /* First character past end of defaut value text */
){
  Table *p;
  Column *pCol;
  sqlite3 *db = pParse->db;
  p = pParse->pNewTable;
  if( p!=0 ){
    int isInit = db->init.busy && db->init.iDb!=1;
    pCol = &(p->aCol[p->nCol-1]);
    if( !sqlite3ExprIsConstantOrFunction(pExpr, isInit) ){
      sqlite3ErrorMsg(pParse, "default value of column [%s] is not constant",
          pCol->zCnName);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
    }else if( pCol->colFlags & COLFLAG_GENERATED ){
      testcase( pCol->colFlags & COLFLAG_VIRTUAL );
      testcase( pCol->colFlags & COLFLAG_STORED );
      sqlite3ErrorMsg(pParse, "cannot use DEFAULT on a generated column");
#endif
    }else{
      /* A copy of pExpr is used instead of the original, as pExpr contains
      ** tokens that point to volatile memory.
      */
      Expr x, *pDfltExpr;
      memset(&x, 0, sizeof(x));
      x.op = TK_SPAN;
      x.u.zToken = sqlite3DbSpanDup(db, zStart, zEnd);
      x.pLeft = pExpr;
      x.flags = EP_Skip;
      pDfltExpr = sqlite3ExprDup(db, &x, EXPRDUP_REDUCE);
      sqlite3DbFree(db, x.u.zToken);
      sqlite3ColumnSetExpr(pParse, p, pCol, pDfltExpr);
    }
  }
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprUnmap(pParse, pExpr);
  }
  sqlite3ExprDelete(db, pExpr);
}